

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

bool __thiscall
amrex::BoxArray::contains(BoxArray *this,BoxArray *ba,bool assume_disjoint_ba,IntVect *ng)

{
  element_type *peVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  Box local_68;
  Box local_4c;
  
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(pointer *)
       ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8) !=
      (peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    minimalBox(&local_68,this);
    iVar8 = (int)((ulong)*(undefined8 *)(ng->vect + 1) >> 0x20);
    iVar7 = (int)*(undefined8 *)(ng->vect + 1);
    local_68.bigend.vect[0] = ng->vect[0] + local_68.bigend.vect[0];
    local_68.smallend.vect[0] = local_68.smallend.vect[0] - ng->vect[0];
    local_68.smallend.vect[1] = local_68.smallend.vect[1] - iVar7;
    local_68.smallend.vect[2] = local_68.smallend.vect[2] - iVar8;
    local_68.bigend.vect[1] = local_68.bigend.vect[1] + iVar7;
    local_68.bigend.vect[2] = local_68.bigend.vect[2] + iVar8;
    minimalBox(&local_4c,ba);
    if ((((local_68.smallend.vect[0] <= local_4c.smallend.vect[0]) &&
         (local_68.smallend.vect[1] <= local_4c.smallend.vect[1])) &&
        (local_68.smallend.vect[2] <= local_4c.smallend.vect[2])) &&
       (((local_4c.bigend.vect[0] <= local_68.bigend.vect[0] &&
         (local_4c.bigend.vect[1] <= local_68.bigend.vect[1])) &&
        (local_4c.bigend.vect[2] <= local_68.bigend.vect[2])))) {
      peVar1 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = (int)((long)*(pointer *)
                           ((long)&(peVar1->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data >> 2) * -0x49249249;
      if ((int)uVar4 < 1) {
        return (int)uVar4 < 1;
      }
      BATransformer::operator()
                (&local_68,&ba->m_bat,
                 (((ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start);
      bVar3 = contains(this,&local_68,assume_disjoint_ba,ng);
      if (!bVar3) {
        return (int)uVar4 < 1;
      }
      lVar6 = 0x1c;
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if ((uVar4 & 0x7fffffff) == uVar5) break;
        BATransformer::operator()
                  (&local_68,&ba->m_bat,
                   (Box *)(*(long *)&(((ba->m_ref).
                                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar6));
        bVar3 = contains(this,&local_68,assume_disjoint_ba,ng);
        lVar6 = lVar6 + 0x1c;
        uVar2 = uVar5 + 1;
      } while (bVar3);
      return (uVar4 & 0x7fffffff) <= uVar5;
    }
  }
  return false;
}

Assistant:

bool
BoxArray::contains (const BoxArray& ba, bool assume_disjoint_ba, const IntVect& ng) const
{
    if (size() == 0) return false;

    if (!minimalBox().grow(ng).contains(ba.minimalBox())) return false;

    for (int i = 0, N = ba.size(); i < N; ++i) {
        if (!contains(ba[i],assume_disjoint_ba, ng)) {
            return false;
        }
    }

    return true;
}